

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

unsigned_long
AdaptingInputOnlyProcess
          (PaUtilBufferProcessor *bp,int *streamCallbackResult,
          PaUtilChannelDescriptor *hostInputChannels,unsigned_long framesToProcess)

{
  uint uVar1;
  PaStreamCallbackTimeInfo *pPVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  PaUtilChannelDescriptor *pPVar9;
  unsigned_long uVar10;
  uint uVar11;
  ulong uVar12;
  void **ppvVar13;
  undefined1 auVar14 [16];
  int *piVar15;
  void **ppvVar16;
  
  uVar12 = bp->framesPerUserBuffer;
  uVar4 = bp->framesInTempInputBuffer;
  uVar10 = 0;
  piVar15 = streamCallbackResult;
  do {
    uVar5 = uVar12 - uVar4;
    if (uVar4 + framesToProcess <= uVar12) {
      uVar5 = framesToProcess;
    }
    ppvVar13 = (void **)bp->tempInputBuffer;
    uVar1 = bp->bytesPerUserInputSample;
    if (bp->userInputIsInterleaved == 0) {
      uVar11 = bp->inputChannelCount;
      if ((ulong)uVar11 != 0) {
        uVar7 = 0;
        uVar8 = 0;
        do {
          bp->tempInputBufferPtrs[uVar8] = (void *)(uVar7 * uVar12 + (long)bp->tempInputBuffer);
          uVar8 = uVar8 + 1;
          uVar7 = uVar7 + uVar1;
        } while (uVar11 != uVar8);
      }
      uVar7 = uVar1 * (int)uVar12;
      ppvVar16 = bp->tempInputBufferPtrs;
      uVar6 = 1;
      streamCallbackResult = piVar15;
    }
    else {
      uVar11 = bp->inputChannelCount;
      uVar7 = uVar1;
      uVar1 = uVar11 * uVar1;
      ppvVar16 = ppvVar13;
      uVar6 = uVar11;
    }
    if (uVar11 != 0) {
      ppvVar13 = (void **)((long)ppvVar13 + uVar4 * uVar1);
      uVar12 = 0;
      pPVar9 = hostInputChannels;
      streamCallbackResult = piVar15;
      do {
        (*bp->inputConverter)
                  (ppvVar13,uVar6,pPVar9->data,pPVar9->stride,(uint)uVar5,&bp->ditherGenerator);
        ppvVar13 = (void **)((long)ppvVar13 + (ulong)uVar7);
        pPVar9->data = (void *)((long)pPVar9->data +
                               (ulong)bp->bytesPerHostInputSample * pPVar9->stride * uVar5);
        uVar12 = uVar12 + 1;
        pPVar9 = pPVar9 + 1;
      } while (uVar12 < bp->inputChannelCount);
      uVar12 = bp->framesPerUserBuffer;
      uVar4 = bp->framesInTempInputBuffer;
      piVar15 = streamCallbackResult;
    }
    uVar4 = uVar4 + uVar5;
    bp->framesInTempInputBuffer = uVar4;
    if (uVar4 == uVar12) {
      if (*streamCallbackResult == 0) {
        pPVar2 = bp->timeInfo;
        pPVar2->outputBufferDacTime = 0.0;
        iVar3 = (*bp->streamCallback)
                          (ppvVar16,(void *)0x0,uVar12,pPVar2,bp->callbackStatusFlags,bp->userData);
        *streamCallbackResult = iVar3;
        uVar12 = bp->framesPerUserBuffer;
        auVar14._8_4_ = (int)(uVar12 >> 0x20);
        auVar14._0_8_ = uVar12;
        auVar14._12_4_ = 0x45300000;
        bp->timeInfo->inputBufferAdcTime =
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) * bp->samplePeriod +
             bp->timeInfo->inputBufferAdcTime;
      }
      bp->framesInTempInputBuffer = 0;
      uVar4 = 0;
    }
    uVar10 = uVar10 + uVar5;
    framesToProcess = framesToProcess - uVar5;
  } while (framesToProcess != 0);
  return uVar10;
}

Assistant:

static unsigned long AdaptingInputOnlyProcess( PaUtilBufferProcessor *bp,
        int *streamCallbackResult,
        PaUtilChannelDescriptor *hostInputChannels,
        unsigned long framesToProcess )
{
    void *userInput, *userOutput;
    unsigned char *destBytePtr;
    unsigned int destSampleStrideSamples; /* stride from one sample to the next within a channel, in samples */
    unsigned int destChannelStrideBytes; /* stride from one channel to the next, in bytes */
    unsigned int i;
    unsigned long frameCount;
    unsigned long framesToGo = framesToProcess;
    unsigned long framesProcessed = 0;

    userOutput = 0;

    do
    {
        frameCount = ( bp->framesInTempInputBuffer + framesToGo > bp->framesPerUserBuffer )
                ? ( bp->framesPerUserBuffer - bp->framesInTempInputBuffer )
                : framesToGo;

        /* convert frameCount samples into temp buffer */

        if( bp->userInputIsInterleaved )
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->inputChannelCount *
                    bp->framesInTempInputBuffer;

            destSampleStrideSamples = bp->inputChannelCount;
            destChannelStrideBytes = bp->bytesPerUserInputSample;

            userInput = bp->tempInputBuffer;
        }
        else /* user input is not interleaved */
        {
            destBytePtr = ((unsigned char*)bp->tempInputBuffer) +
                    bp->bytesPerUserInputSample * bp->framesInTempInputBuffer;

            destSampleStrideSamples = 1;
            destChannelStrideBytes = bp->framesPerUserBuffer * bp->bytesPerUserInputSample;

            /* setup non-interleaved ptrs */
            for( i=0; i<bp->inputChannelCount; ++i )
            {
                bp->tempInputBufferPtrs[i] = ((unsigned char*)bp->tempInputBuffer) +
                    i * bp->bytesPerUserInputSample * bp->framesPerUserBuffer;
            }

            userInput = bp->tempInputBufferPtrs;
        }

        for( i=0; i<bp->inputChannelCount; ++i )
        {
            bp->inputConverter( destBytePtr, destSampleStrideSamples,
                                    hostInputChannels[i].data,
                                    hostInputChannels[i].stride,
                                    frameCount, &bp->ditherGenerator );

            destBytePtr += destChannelStrideBytes;  /* skip to next destination channel */

            /* advance src ptr for next iteration */
            hostInputChannels[i].data = ((unsigned char*)hostInputChannels[i].data) +
                    frameCount * hostInputChannels[i].stride * bp->bytesPerHostInputSample;
        }

        bp->framesInTempInputBuffer += frameCount;

        if( bp->framesInTempInputBuffer == bp->framesPerUserBuffer )
        {
            /**
            @todo (non-critical optimisation)
            The conditional below implements the continue/complete/abort mechanism
            simply by continuing on iterating through the input buffer, but not
            passing the data to the callback. With care, the outer loop could be
            terminated earlier, thus some unneeded conversion cycles would be
            saved.
            */
            if( *streamCallbackResult == paContinue )
            {
                bp->timeInfo->outputBufferDacTime = 0;

                *streamCallbackResult = bp->streamCallback( userInput, userOutput,
                        bp->framesPerUserBuffer, bp->timeInfo,
                        bp->callbackStatusFlags, bp->userData );

                bp->timeInfo->inputBufferAdcTime += bp->framesPerUserBuffer * bp->samplePeriod;
            }

            bp->framesInTempInputBuffer = 0;
        }

        framesProcessed += frameCount;

        framesToGo -= frameCount;
    }while( framesToGo > 0 );

    return framesProcessed;
}